

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flasher.cpp
# Opt level: O1

int __thiscall
Flasher::verify(Flasher *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  uint8_t data;
  _func_int *p_Var1;
  FlasherObserver *pFVar2;
  Samba *pSVar3;
  Flash *pFVar4;
  bool bVar5;
  int iVar6;
  EVP_PKEY_CTX *pEVar7;
  uint16_t crc16;
  uint16_t uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  FILE *__stream;
  long lVar13;
  size_t sVar14;
  int *piVar15;
  undefined8 *puVar16;
  Flasher *pFVar17;
  long lVar18;
  uint32_t start_addr;
  pointer_____offset_0x10___ *ppuVar19;
  void *__ptr;
  ulong uVar20;
  undefined8 uStack_80;
  int *local_78;
  ulong local_70;
  int *local_68;
  FILE *local_60;
  uint local_54;
  ulong local_50;
  ulong local_48;
  EVP_PKEY_CTX *local_40;
  Flasher *local_38;
  
  local_38 = (Flasher *)CONCAT44(local_38._4_4_,(int)tbs);
  uStack_80 = 0x10ab9d;
  local_40 = ctx;
  uVar9 = (*((this->_flash->_M_t).super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t.
             super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
             super__Head_base<0UL,_Flash_*,_false>._M_head_impl)->_vptr_Flash[3])();
  local_50 = (ulong)uVar9;
  uVar12 = local_50 + 0xf & 0xfffffffffffffff0;
  __ptr = (void *)((long)&local_78 - uVar12);
  lVar18 = (long)__ptr - uVar12;
  sig[0] = '\0';
  sig[1] = '\0';
  sig[2] = '\0';
  sig[3] = '\0';
  uVar11 = (uint)local_38;
  *(undefined4 *)siglen = 0;
  local_70 = ((ulong)local_38 & 0xffffffff) / (ulong)uVar9;
  local_78 = (int *)siglen;
  local_68 = (int *)sig;
  if ((int)(((ulong)local_38 & 0xffffffff) % (ulong)uVar9) != 0) {
LAB_0010ae16:
    *(undefined8 *)(lVar18 + -8) = 0x10ae20;
    puVar16 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar16 = &PTR__exception_00119388;
    *(undefined8 *)(lVar18 + -8) = 0x10ae40;
    __cxa_throw(puVar16,&FlashOffsetError::typeinfo,std::exception::~exception);
  }
  p_Var1 = ((this->_flash->_M_t).super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t.
            super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
            super__Head_base<0UL,_Flash_*,_false>._M_head_impl)->_vptr_Flash[6];
  *(undefined8 *)(lVar18 + -8) = 0x10abf4;
  uVar9 = (*p_Var1)();
  pEVar7 = local_40;
  if (uVar9 <= uVar11) goto LAB_0010ae16;
  local_38 = this;
  *(undefined8 *)(lVar18 + -8) = 0x10ac11;
  __stream = fopen((char *)pEVar7,"rb");
  if (__stream == (FILE *)0x0) {
    *(undefined8 *)(lVar18 + -8) = 0x10ae74;
    puVar16 = (undefined8 *)__cxa_allocate_exception(0x10);
    *(undefined8 *)(lVar18 + -8) = 0x10ae7c;
    piVar15 = __errno_location();
    iVar10 = *piVar15;
    *puVar16 = &PTR__exception_001193b0;
    *(int *)(puVar16 + 1) = iVar10;
    *(undefined8 *)(lVar18 + -8) = 0x10aea1;
    __cxa_throw(puVar16,&FileOpenError::typeinfo,std::exception::~exception);
  }
  *(undefined8 *)(lVar18 + -8) = 0x10ac2c;
  iVar10 = fseek(__stream,0,2);
  local_60 = __stream;
  if (iVar10 == 0) {
    *(undefined8 *)(lVar18 + -8) = 0x10ac40;
    lVar13 = ftell(__stream);
    if (-1 < lVar13) {
      *(undefined8 *)(lVar18 + -8) = 0x10ac54;
      rewind(__stream);
      local_48 = (long)(local_50 + lVar13 + -1) / (long)local_50;
      p_Var1 = ((local_38->_flash->_M_t).super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>.
                _M_t.super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
                super__Head_base<0UL,_Flash_*,_false>._M_head_impl)->_vptr_Flash[4];
      *(undefined8 *)(lVar18 + -8) = 0x10ac79;
      uVar11 = (*p_Var1)();
      if ((uint)local_48 <= uVar11) {
        pFVar2 = local_38->_observer;
        local_40 = (EVP_PKEY_CTX *)0x0;
        p_Var1 = pFVar2->_vptr_FlasherObserver[2];
        *(undefined8 *)(lVar18 + -8) = 0x10aca4;
        (*p_Var1)(pFVar2,"Verify %ld bytes of flash\n",lVar13);
        while( true ) {
          uVar12 = local_50;
          *(undefined8 *)(lVar18 + -8) = 0x10acb8;
          sVar14 = fread(__ptr,1,uVar12,__stream);
          pFVar17 = local_38;
          pEVar7 = local_40;
          uVar12 = local_48;
          if (sVar14 == 0) break;
          pFVar2 = local_38->_observer;
          p_Var1 = pFVar2->_vptr_FlasherObserver[3];
          *(undefined8 *)(lVar18 + -8) = 0x10acda;
          (*p_Var1)(pFVar2,pEVar7,uVar12);
          if (pFVar17->_samba->_canChecksumBuffer == true) {
            crc16 = 0;
            uVar12 = 0;
            uVar20 = 1;
            do {
              pSVar3 = pFVar17->_samba;
              data = *(uint8_t *)((long)__ptr + uVar12);
              *(undefined8 *)(lVar18 + -8) = 0x10ad08;
              crc16 = Samba::checksumCalc(pSVar3,data,crc16);
              __stream = local_60;
              bVar5 = uVar20 < sVar14;
              uVar12 = uVar20;
              pFVar17 = local_38;
              uVar20 = (ulong)((int)uVar20 + 1);
            } while (bVar5);
            pSVar3 = local_38->_samba;
            local_54 = (int)local_40 + (int)local_70;
            start_addr = local_54 * (int)local_50;
            *(undefined8 *)(lVar18 + -8) = 0x10ad3c;
            uVar8 = Samba::checksumBuffer(pSVar3,start_addr,(uint32_t)sVar14);
            iVar10 = 0;
            if (uVar8 != crc16) {
              pFVar4 = (local_38->_flash->_M_t).
                       super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t.
                       super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
                       super__Head_base<0UL,_Flash_*,_false>._M_head_impl;
              uVar12 = (ulong)local_54;
              p_Var1 = pFVar4->_vptr_Flash[0x19];
              *(undefined8 *)(lVar18 + -8) = 0x10ad5e;
              (*p_Var1)(pFVar4,uVar12,lVar18);
              uVar12 = 0;
              iVar10 = 0;
              do {
                iVar10 = iVar10 + (uint)(*(char *)((long)__ptr + uVar12) !=
                                        *(char *)(lVar18 + uVar12));
                uVar12 = uVar12 + 1;
              } while ((uVar12 & 0xffffffff) < sVar14);
            }
          }
          else {
            pFVar4 = (pFVar17->_flash->_M_t).
                     super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t.
                     super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
                     super__Head_base<0UL,_Flash_*,_false>._M_head_impl;
            iVar10 = (int)local_40;
            iVar6 = (int)local_70;
            p_Var1 = pFVar4->_vptr_Flash[0x19];
            *(undefined8 *)(lVar18 + -8) = 0x10ad9b;
            (*p_Var1)(pFVar4,(ulong)(uint)(iVar10 + iVar6),lVar18);
            uVar12 = 0;
            iVar10 = 0;
            do {
              iVar10 = iVar10 + (uint)(*(char *)((long)__ptr + uVar12) != *(char *)(lVar18 + uVar12)
                                      );
              uVar12 = uVar12 + 1;
            } while ((uVar12 & 0xffffffff) < sVar14);
          }
          if (iVar10 != 0) {
            *local_68 = *local_68 + 1;
            *local_78 = *local_78 + iVar10;
          }
          uVar11 = (int)local_40 + 1;
          local_40 = (EVP_PKEY_CTX *)(ulong)uVar11;
          if ((uVar11 == (uint)local_48) || (sVar14 != local_50)) break;
        }
        *(undefined8 *)(lVar18 + -8) = 0x10ade9;
        fclose(__stream);
        pFVar2 = local_38->_observer;
        uVar12 = local_48 & 0xffffffff;
        p_Var1 = pFVar2->_vptr_FlasherObserver[3];
        *(undefined8 *)(lVar18 + -8) = 0x10adfd;
        (*p_Var1)(pFVar2,uVar12);
        return (int)CONCAT71((int7)((ulong)local_68 >> 8),*local_68 == 0);
      }
      *(undefined8 *)(lVar18 + -8) = 0x10aeab;
      puVar16 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar16 = &PTR__exception_00119400;
      ppuVar19 = &FileSizeError::typeinfo;
      goto LAB_0010aebf;
    }
  }
  *(undefined8 *)(lVar18 + -8) = 0x10ae4a;
  puVar16 = (undefined8 *)__cxa_allocate_exception(0x10);
  *(undefined8 *)(lVar18 + -8) = 0x10ae52;
  piVar15 = __errno_location();
  iVar10 = *piVar15;
  *puVar16 = &PTR__exception_001193d8;
  *(int *)(puVar16 + 1) = iVar10;
  ppuVar19 = &FileIoError::typeinfo;
LAB_0010aebf:
  *(undefined1 **)(lVar18 + -8) = &LAB_0010aece;
  __cxa_throw(puVar16,ppuVar19,std::exception::~exception);
}

Assistant:

bool
Flasher::verify(const char* filename, uint32_t& pageErrors, uint32_t& totalErrors, uint32_t foffset)
{
    FILE* infile;
    uint32_t pageSize = _flash->pageSize();
    uint8_t bufferA[pageSize];
    uint8_t bufferB[pageSize];
    uint32_t pageNum = 0;
    uint32_t numPages;
    uint32_t pageOffset;
    uint32_t byteErrors = 0;
    uint16_t calcCrc = 0;
    uint16_t flashCrc;
    long fsize;
    size_t fbytes;

    pageErrors = 0;
    totalErrors = 0;

    if (foffset % pageSize != 0 || foffset >= _flash->totalSize())
        throw FlashOffsetError();
    
    pageOffset = foffset / pageSize;
    
    infile = fopen(filename, "rb");
    if (!infile)
        throw FileOpenError(errno);

    try
    {
        if (fseek(infile, 0, SEEK_END) != 0 || (fsize = ftell(infile)) < 0)
            throw FileIoError(errno);
        
        rewind(infile);

        numPages = (fsize + pageSize - 1) / pageSize;
        if (numPages > _flash->numPages())
            throw FileSizeError();

        _observer.onStatus("Verify %ld bytes of flash\n", fsize);

        while ((fbytes = fread(bufferA, 1, pageSize, infile)) > 0)
        {
            byteErrors = 0;
            calcCrc = 0;
            _observer.onProgress(pageNum, numPages);

            if (_samba.canChecksumBuffer())
            {
                for (uint32_t i = 0; i < fbytes; i++)
                    calcCrc = _samba.checksumCalc(bufferA[i], calcCrc);
                
                

                flashCrc = _samba.checksumBuffer((pageOffset + pageNum) * pageSize, fbytes);
                
                if (flashCrc != calcCrc)
                {
                    _flash->readPage(pageOffset + pageNum, bufferB);

                    for (uint32_t i = 0; i < fbytes; i++)
                    {
                        if (bufferA[i] != bufferB[i])
                            byteErrors++;
                    }
                }
            }
            else
            {
                _flash->readPage(pageOffset + pageNum, bufferB);

                for (uint32_t i = 0; i < fbytes; i++)
                {
                    if (bufferA[i] != bufferB[i])
                        byteErrors++;
                }
            }
            
            if (byteErrors != 0)
            {
                pageErrors++;
                totalErrors += byteErrors;
            }

            pageNum++;
            if (pageNum == numPages || fbytes != pageSize)
                break;
        }
    }
    catch(...)
    {
        fclose(infile);
        throw;
    }
    
    fclose(infile);

     _observer.onProgress(numPages, numPages);
    
    if (pageErrors != 0)
        return false;

    return true;
}